

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS.h
# Opt level: O2

tuple<N_*> __thiscall NS::wrap<int>(NS *this,int item)

{
  pointer ppNVar1;
  undefined4 in_EDX;
  undefined4 in_register_00000034;
  
  ppNVar1 = (pointer)N::operator_new(0x78,(NS *)CONCAT44(in_register_00000034,item));
  ppNVar1[2] = (N *)0x0;
  *ppNVar1 = (N *)0x0;
  ppNVar1[1] = (N *)0x0;
  ppNVar1[4] = (N *)0x0;
  ppNVar1[5] = (N *)0x0;
  ppNVar1[6] = (N *)0x0;
  ppNVar1[7] = (N *)0x0;
  ppNVar1[8] = (N *)0x0;
  ppNVar1[9] = (N *)0x0;
  *(undefined4 *)(ppNVar1 + 10) = in_EDX;
  *(undefined1 *)(ppNVar1 + 0xe) = 1;
  (this->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data._M_start
       = ppNVar1;
  return (_Tuple_impl<0UL,_N_*>)(_Tuple_impl<0UL,_N_*>)this;
}

Assistant:

std::tuple<N*> wrap(DataType item) {
        return std::make_tuple(new(this) N(item));
    }